

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

Lf_Cut_t * Lf_MemLoadMuxCut(Lf_Man_t *p,int iObj,Lf_Cut_t *pCut)

{
  int iVar1;
  Gia_Obj_t *pObj;
  
  pObj = Gia_ManObj(p->pGia,iObj);
  iVar1 = Gia_ObjIsMux(p->pGia,pObj);
  if (iVar1 != 0) {
    pCut->iFunc = -(uint)(p->pPars->fCutMin == 0) | 4;
    *(uint *)&pCut[1].Sign = iObj - (*(uint *)pObj & 0x1fffffff);
    *(uint *)((long)&pCut[1].Sign + 4) = iObj - (*(uint *)&pObj->field_0x4 & 0x1fffffff);
    iVar1 = Gia_ObjFaninId2(p->pGia,iObj);
    pCut[1].Delay = iVar1;
    *(uint *)&pCut->field_0x14 = *(uint *)&pCut->field_0x14 & 0x7fffff | 0x3800000;
    return pCut;
  }
  __assert_fail("Gia_ObjIsMux(p->pGia, pMux)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                ,0x244,"Lf_Cut_t *Lf_MemLoadMuxCut(Lf_Man_t *, int, Lf_Cut_t *)");
}

Assistant:

static inline Lf_Cut_t * Lf_MemLoadMuxCut( Lf_Man_t * p, int iObj, Lf_Cut_t * pCut )
{
    Gia_Obj_t * pMux = Gia_ManObj( p->pGia, iObj );
    assert( Gia_ObjIsMux(p->pGia, pMux) );
    pCut->iFunc = p->pPars->fCutMin ? 4 : -1;
    pCut->pLeaves[0] = Gia_ObjFaninId0( pMux, iObj );
    pCut->pLeaves[1] = Gia_ObjFaninId1( pMux, iObj );
    pCut->pLeaves[2] = Gia_ObjFaninId2( p->pGia, iObj );
    pCut->nLeaves = 3;
    pCut->fMux7 = 1;
    return pCut;
}